

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body_centered_cubic.hpp
# Opt level: O2

void __thiscall
sisl::body_centered_cubic<char>::each_site
          (body_centered_cubic<char> *this,
          function<void_(const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_&)> *func,bool parallel)

{
  bool bVar1;
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *this_00;
  Scalar *i;
  Scalar *j;
  Scalar *k;
  int iVar2;
  int iVar3;
  int local_7c;
  int local_78;
  int local_74;
  ulong local_70;
  function<void_(const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_&)> *local_68;
  lattice_site s;
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> local_50;
  
  local_68 = func;
  for (local_70 = 0; (int)local_70 <= this->_nx; local_70 = (ulong)((int)local_70 + 2)) {
    for (iVar3 = 0; iVar3 <= this->_ny; iVar3 = iVar3 + 2) {
      for (local_7c = 0; local_7c <= this->_nz; local_7c = local_7c + 1) {
        local_50.m_xpr._0_4_ = 3;
        Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::Matrix<int>
                  ((Matrix<int,__1,_1,_0,__1,_1> *)&s,(int *)&local_50);
        iVar2 = local_7c % 2;
        local_74 = (int)local_70 + iVar2;
        Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::CommaInitializer
                  (&local_50,(Matrix<int,__1,_1,_0,__1,_1> *)&s,&local_74);
        local_78 = iVar2 + iVar3;
        this_00 = Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_
                            (&local_50,&local_78);
        Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_(this_00,&local_7c);
        Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::finished(&local_50);
        i = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&s,0);
        j = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&s,1);
        k = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&s,2);
        bVar1 = in_bound(this,i,j,k);
        if (bVar1) {
          std::function<void_(const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_&)>::operator()
                    (local_68,(Matrix<int,__1,_1,_0,__1,_1> *)&s);
        }
        free(s.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      }
    }
  }
  return;
}

Assistant:

virtual void each_site(const std::function<void(const lattice_site &)> &func, bool parallel = false) {
            #pragma omp parallel for if(parallel)
            for(int i = 0; i <= _nx; i+= 2)
                for(int j = 0; j <= _ny; j+=2)
                    for(int k = 0; k <= _nz; k++) {
                        lattice_site s(3);
                        int zmod = k % 2;
                        s << i+zmod,j+zmod,k;
                        if(in_bound(s[0], s[1],s[2]))
                            func(s);
                    }
        }